

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::PutVal(TPZSkylMatrix<double> *this,int64_t r,int64_t c,double *value)

{
  double **ppdVar1;
  double *pdVar2;
  long lVar3;
  
  lVar3 = r - c;
  if (lVar3 == 0 || r < c) {
    lVar3 = -(r - c);
    r = c;
  }
  ppdVar1 = (this->fElem).fStore;
  pdVar2 = ppdVar1[r];
  if ((long)ppdVar1[r + 1] - (long)pdVar2 >> 3 <= lVar3) {
    if (ABS(*value) < 1e-12) {
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size",0x1a);
    std::ostream::_M_insert<long>((long)&std::cout);
    std::ostream::flush();
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = double]"
               ,"Index out of range");
    pdVar2 = (this->fElem).fStore[r];
  }
  pdVar2[lVar3] = *value;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}